

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piece_picker.cpp
# Opt level: O0

void __thiscall libtorrent::aux::piece_picker::we_dont_have(piece_picker *this,piece_index_t index)

{
  bool bVar1;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> sVar2;
  int iVar3;
  value_type *this_00;
  pointer pdVar4;
  strong_typedef<int,_libtorrent::aux::piece_index_tag,_void> local_4c;
  int local_48;
  int local_44;
  downloading_piece *local_40;
  int local_38;
  uchar local_31;
  __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
  local_30;
  iterator i;
  download_queue_t download_state;
  piece_pos *p;
  piece_picker *this_local;
  piece_index_t index_local;
  
  i._M_current._4_4_ = index.m_val;
  this_00 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
            ::operator[](&this->m_piece_map,
                         (strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>)index.m_val);
  bVar1 = piece_pos::have(this_00);
  if (bVar1) {
    this->m_num_passed = this->m_num_passed + -1;
    bVar1 = piece_pos::filtered(this_00);
    if (bVar1) {
      local_44 = index.m_val;
      iVar3 = pad_bytes_in_piece(this,index);
      this->m_filtered_pad_bytes = (long)iVar3 + this->m_filtered_pad_bytes;
      this->m_num_filtered = this->m_num_filtered + 1;
      local_48 = index.m_val;
      iVar3 = pad_bytes_in_piece(this,index);
      this->m_have_filtered_pad_bytes = this->m_have_filtered_pad_bytes - (long)iVar3;
      this->m_num_have_filtered = this->m_num_have_filtered + -1;
    }
    else {
      bVar1 = strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::operator==
                        (&this->m_reverse_cursor,&this->m_cursor);
      if (bVar1) {
        strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>::strong_typedef(&local_4c,0);
        (this->m_reverse_cursor).m_val = local_4c.m_val;
        sVar2 = container_wrapper<libtorrent::aux::piece_picker::piece_pos,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_std::vector<libtorrent::aux::piece_picker::piece_pos,_std::allocator<libtorrent::aux::piece_picker::piece_pos>_>_>
                ::end_index(&this->m_piece_map);
        (this->m_cursor).m_val = sVar2.m_val;
      }
    }
    this->m_num_have = this->m_num_have + -1;
    iVar3 = pad_bytes_in_piece(this,index);
    this->m_have_pad_bytes = this->m_have_pad_bytes - (long)iVar3;
    piece_pos::set_not_have(this_00);
    if (((this->m_dirty & 1U) == 0) && (iVar3 = piece_pos::priority(this_00,this), -1 < iVar3)) {
      add(this,index);
    }
  }
  else {
    i._M_current._3_1_ = piece_pos::download_queue(this_00);
    bVar1 = strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void>::operator==
                      ((strong_typedef<unsigned_char,_libtorrent::aux::dl_queue_tag,_void> *)
                       ((long)&i._M_current + 3),&piece_pos::piece_open);
    if (!bVar1) {
      local_31 = i._M_current._3_1_;
      local_38 = index.m_val;
      local_30._M_current = (downloading_piece *)find_dl_piece(this,i._M_current._3_1_,index);
      pdVar4 = __gnu_cxx::
               __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
               ::operator->(&local_30);
      if ((*(uint *)&pdVar4->field_0x6 >> 0xf & 1) != 0) {
        pdVar4 = __gnu_cxx::
                 __normal_iterator<libtorrent::aux::piece_picker::downloading_piece_*,_std::vector<libtorrent::aux::piece_picker::downloading_piece,_std::allocator<libtorrent::aux::piece_picker::downloading_piece>_>_>
                 ::operator->(&local_30);
        *(uint *)&pdVar4->field_0x6 = *(uint *)&pdVar4->field_0x6 & 0xffff7fff;
        this->m_num_passed = this->m_num_passed + -1;
      }
      local_40 = local_30._M_current;
      erase_download_piece(this,(iterator)local_30._M_current);
    }
  }
  return;
}

Assistant:

void piece_picker::we_dont_have(piece_index_t const index)
	{
		INVARIANT_CHECK;
		piece_pos& p = m_piece_map[index];

#ifdef TORRENT_PICKER_LOG
		std::cerr << "[" << this << "] " << "piece_picker::we_dont_have("
			<< index << ")" << std::endl;
#endif

		if (!p.have())
		{
			// even though we don't have the piece, it
			// might still have passed hash check
			auto const download_state = p.download_queue();
			if (download_state == piece_pos::piece_open) return;

			auto const i = find_dl_piece(download_state, index);
			if (i->passed_hash_check)
			{
				i->passed_hash_check = false;
				TORRENT_ASSERT(m_num_passed > 0);
				--m_num_passed;
			}
			erase_download_piece(i);
			return;
		}

		TORRENT_ASSERT(m_num_passed > 0);
		--m_num_passed;
		if (p.filtered())
		{
			m_filtered_pad_bytes += pad_bytes_in_piece(index);
			++m_num_filtered;

			TORRENT_ASSERT(m_have_filtered_pad_bytes >= pad_bytes_in_piece(index));
			m_have_filtered_pad_bytes -= pad_bytes_in_piece(index);
			TORRENT_ASSERT(m_num_have_filtered > 0);
			--m_num_have_filtered;
		}
		else
		{
			// update cursors
			if (m_reverse_cursor == m_cursor)
			{
				m_reverse_cursor = piece_index_t(0);
				m_cursor = m_piece_map.end_index();
			}
		}

		--m_num_have;
		m_have_pad_bytes -= pad_bytes_in_piece(index);
		TORRENT_ASSERT(m_have_pad_bytes >= 0);
		p.set_not_have();

		if (m_dirty) return;
		if (p.priority(this) >= 0) add(index);
	}